

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O3

void base_case_new_coord_calculation
               (int ndims,int my_rank,int my_partition,int p_node,int *grid_points,
               int *new_rank_coords,int *dimension_order)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  if (0 < ndims) {
    uVar4 = 0;
    do {
      new_rank_coords[uVar4] = grid_points[uVar4 * 2];
      uVar4 = uVar4 + 1;
    } while ((uint)ndims != uVar4);
    if (0 < ndims) {
      uVar4 = (ulong)(uint)ndims + 1;
      iVar2 = my_rank - p_node * my_partition;
      do {
        iVar1 = dimension_order[uVar4 - 2];
        iVar3 = (grid_points[(long)iVar1 * 2 + 1] - grid_points[iVar1 * 2]) + 1;
        new_rank_coords[iVar1] = new_rank_coords[iVar1] + iVar2 % iVar3;
        uVar4 = uVar4 - 1;
        iVar2 = iVar2 / iVar3;
      } while (1 < uVar4);
    }
  }
  return;
}

Assistant:

void base_case_new_coord_calculation(const int ndims,
					 const int my_rank,
					 const int my_partition,
					 const int p_node,
					 const int *const grid_points,
					 int *const new_rank_coords,
					 const int *const dimension_order) {
  for (int d = 0; d < ndims; d++) {
	new_rank_coords[d] = grid_points[2 * d];
  }

  int my_difference = my_rank - my_partition * p_node;
  int span, d;

  //Idea, fill up the the partitions s.t. if the grid size
  //is 2*p_node, the best split between the two is done
  //according to the ranks
  for (int index = ndims - 1; index >= 0; index--) {
	d = dimension_order[index];
	span = (grid_points[2 * d + 1] - grid_points[2 * d]) + 1;
	new_rank_coords[d] += my_difference % span;
	my_difference /= span;
  }
}